

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

boolean propagate(int mndx,boolean tally,boolean ghostly)

{
  bool bVar1;
  int iVar2;
  boolean gone;
  uchar lim;
  boolean result;
  boolean ghostly_local;
  boolean tally_local;
  int mndx_local;
  
  iVar2 = mbirth_limit(mndx);
  bVar1 = mvitals[mndx].born < (byte)iVar2 && (mvitals[mndx].mvflags & 3) == 0;
  if ((mons[mndx].geno & 0x1000) != 0) {
    mvitals[mndx].mvflags = mvitals[mndx].mvflags | 1;
  }
  if (((mvitals[mndx].born != 0xff) && (tally != '\0')) &&
     ((ghostly == '\0' || ((ghostly != '\0' && (bVar1)))))) {
    mvitals[mndx].born = mvitals[mndx].born + '\x01';
  }
  if ((((byte)iVar2 <= mvitals[mndx].born) && ((mons[mndx].geno & 0x200) == 0)) &&
     ((mvitals[mndx].mvflags & 1) == 0)) {
    mvitals[mndx].mvflags = mvitals[mndx].mvflags | 1;
    reset_rndmonst(mndx);
  }
  return bVar1;
}

Assistant:

boolean propagate(int mndx, boolean tally, boolean ghostly)
{
	boolean result;
	uchar lim = mbirth_limit(mndx);
	boolean gone = (mvitals[mndx].mvflags & G_GONE); /* genocided or extinct */

	result = (((int) mvitals[mndx].born < lim) && !gone) ? TRUE : FALSE;

	/* if it's unique, don't ever make it again */
	if (mons[mndx].geno & G_UNIQ) mvitals[mndx].mvflags |= G_EXTINCT;

	if (mvitals[mndx].born < 255 && tally && (!ghostly || (ghostly && result)))
		 mvitals[mndx].born++;
	if ((int) mvitals[mndx].born >= lim && !(mons[mndx].geno & G_NOGEN) &&
		!(mvitals[mndx].mvflags & G_EXTINCT)) {
		mvitals[mndx].mvflags |= G_EXTINCT;
		reset_rndmonst(mndx);
	}
	return result;
}